

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_contains_bulk
                (roaring64_bitmap_t *r,roaring64_bulk_context_t *context,uint64_t val)

{
  _Bool _Var1;
  int iVar2;
  art_val_t *paVar3;
  undefined4 *in_RSI;
  leaf_t *leaf;
  uint16_t low16;
  uint8_t high48 [6];
  art_t *in_stack_ffffffffffffffb8;
  roaring64_bitmap_t *in_stack_ffffffffffffffc0;
  undefined4 local_26;
  undefined2 local_22;
  
  split_key((uint64_t)in_stack_ffffffffffffffc0,(uint8_t *)in_stack_ffffffffffffffb8);
  if ((*(long *)(in_RSI + 2) == 0) ||
     (iVar2 = art_compare_keys((art_key_chunk_t *)in_stack_ffffffffffffffc0,
                               (art_key_chunk_t *)in_stack_ffffffffffffffb8), iVar2 != 0)) {
    paVar3 = art_find(in_stack_ffffffffffffffb8,(art_key_chunk_t *)0x11d846);
    if (paVar3 == (art_val_t *)0x0) {
      return false;
    }
    *(art_val_t **)(in_RSI + 2) = paVar3;
    *in_RSI = local_26;
    *(undefined2 *)(in_RSI + 1) = local_22;
  }
  get_container(in_stack_ffffffffffffffc0,(leaf_t)in_stack_ffffffffffffffb8);
  get_typecode(**(leaf_t **)(in_RSI + 2));
  _Var1 = container_contains(in_stack_ffffffffffffffb8,0,'\0');
  return _Var1;
}

Assistant:

bool roaring64_bitmap_contains_bulk(const roaring64_bitmap_t *r,
                                    roaring64_bulk_context_t *context,
                                    uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    if (context->leaf == NULL ||
        art_compare_keys(context->high_bytes, high48) != 0) {
        // We're not positioned anywhere yet or the high bits of the key
        // differ.
        leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
        if (leaf == NULL) {
            return false;
        }
        context->leaf = leaf;
        memcpy(context->high_bytes, high48, ART_KEY_BYTES);
    }
    return container_contains(get_container(r, *context->leaf), low16,
                              get_typecode(*context->leaf));
}